

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O2

void __thiscall
gl4cts::GLSL420Pack::Utils::texture::createBuffer
          (texture *this,GLenum internal_format,GLuint buffer_id)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  socklen_t __len;
  sockaddr *__addr;
  long lVar3;
  
  iVar1 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  release(this);
  this->m_texture_type = TEX_BUFFER;
  this->m_buffer_id = buffer_id;
  (**(code **)(lVar3 + 0x6f8))(1,this);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  iVar1 = 0x17f0739;
  __len = 0x486f;
  glu::checkError(dVar2,"GenTextures",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                  ,0x486f);
  bind(this,iVar1,__addr,__len);
  (**(code **)(lVar3 + 0x12f8))(0x8c2a,internal_format,buffer_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"TexBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                  ,0x4874);
  return;
}

Assistant:

void Utils::texture::createBuffer(GLenum internal_format, GLuint buffer_id)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	release();

	m_texture_type = TEX_BUFFER;
	m_buffer_id	= buffer_id;

	gl.genTextures(1, &m_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GenTextures");

	bind();

	gl.texBuffer(GL_TEXTURE_BUFFER, internal_format, buffer_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "TexBuffer");
}